

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool glslang::OutputSpvHex
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,char *baseName,
               char *varName)

{
  uint uVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  int iVar4;
  _Setw _Var5;
  ulong uVar6;
  ostream *poVar7;
  void *this;
  size_type sVar8;
  const_reference pvVar9;
  int local_238;
  uint word;
  int j;
  int i;
  int WORDS_PER_LINE;
  ofstream out;
  char *varName_local;
  char *baseName_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  
  std::ofstream::ofstream(&WORDS_PER_LINE);
  std::operator|(_S_bin,_S_out);
  std::ofstream::open((char *)&WORDS_PER_LINE,(_Ios_Openmode)baseName);
  uVar6 = std::ios::fail();
  if ((uVar6 & 1) == 0) {
    poVar7 = std::operator<<((ostream *)&WORDS_PER_LINE,"\t// ");
    iVar4 = GetSpirvGeneratorVersion();
    this = (void *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = (ostream *)std::ostream::operator<<(this,0xf);
    poVar7 = std::operator<<(poVar7,".");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,2);
    poVar7 = std::operator<<(poVar7,".");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
    poVar7 = std::operator<<(poVar7,"");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    if (varName != (char *)0x0) {
      poVar7 = std::operator<<((ostream *)&WORDS_PER_LINE,"\t #pragma once");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&WORDS_PER_LINE,"const uint32_t ");
      poVar7 = std::operator<<(poVar7,varName);
      poVar7 = std::operator<<(poVar7,"[] = {");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    word = 0;
    while( true ) {
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
      if ((int)sVar8 <= (int)word) break;
      std::operator<<((ostream *)&WORDS_PER_LINE,"\t");
      local_238 = 0;
      while( true ) {
        bVar2 = false;
        if (local_238 < 8) {
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
          bVar2 = (int)(word + local_238) < (int)sVar8;
        }
        if (!bVar2) break;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (spirv,(long)(int)(word + local_238));
        uVar1 = *pvVar9;
        poVar7 = std::operator<<((ostream *)&WORDS_PER_LINE,"0x");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
        _Var5 = std::setw(8);
        poVar7 = std::operator<<(poVar7,_Var5);
        _Var3 = std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,_Var3._M_c);
        std::ostream::operator<<(poVar7,uVar1);
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
        if ((int)(word + local_238 + 1) < (int)sVar8) {
          std::operator<<((ostream *)&WORDS_PER_LINE,",");
        }
        local_238 = local_238 + 1;
      }
      std::ostream::operator<<(&WORDS_PER_LINE,std::endl<char,std::char_traits<char>>);
      word = word + 8;
    }
    if (varName != (char *)0x0) {
      std::operator<<((ostream *)&WORDS_PER_LINE,"};");
      std::ostream::operator<<(&WORDS_PER_LINE,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    spirv_local._7_1_ = true;
  }
  else {
    printf("ERROR: Failed to open file: %s\n",baseName);
    spirv_local._7_1_ = false;
  }
  std::ofstream::~ofstream(&WORDS_PER_LINE);
  return spirv_local._7_1_;
}

Assistant:

bool OutputSpvHex(const std::vector<unsigned int>& spirv, const char* baseName, const char* varName)
{
    std::ofstream out;
    out.open(baseName, std::ios::binary | std::ios::out);
    if (out.fail()) {
        printf("ERROR: Failed to open file: %s\n", baseName);
        return false;
    }
    out << "\t// " <<
        GetSpirvGeneratorVersion() <<
        GLSLANG_VERSION_MAJOR << "." << GLSLANG_VERSION_MINOR << "." << GLSLANG_VERSION_PATCH <<
        GLSLANG_VERSION_FLAVOR << std::endl;
    if (varName != nullptr) {
        out << "\t #pragma once" << std::endl;
        out << "const uint32_t " << varName << "[] = {" << std::endl;
    }
    const int WORDS_PER_LINE = 8;
    for (int i = 0; i < (int)spirv.size(); i += WORDS_PER_LINE) {
        out << "\t";
        for (int j = 0; j < WORDS_PER_LINE && i + j < (int)spirv.size(); ++j) {
            const unsigned int word = spirv[i + j];
            out << "0x" << std::hex << std::setw(8) << std::setfill('0') << word;
            if (i + j + 1 < (int)spirv.size()) {
                out << ",";
            }
        }
        out << std::endl;
    }
    if (varName != nullptr) {
        out << "};";
        out << std::endl;
    }
    out.close();
    return true;
}